

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  SourceLineInfo *_lineInfo;
  size_t *psVar1;
  TestCase *_name;
  IStreamingReporter *pIVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  bool _missingAssertions;
  uint uVar6;
  double _durationInSeconds;
  undefined1 local_510 [8];
  SectionStats testCaseSectionStats;
  undefined1 local_270 [8];
  Counts assertions;
  undefined1 local_e0 [8];
  SectionInfo testCaseSection;
  allocator local_32;
  allocator local_31;
  
  _name = this->m_activeTestCase;
  _lineInfo = &(_name->super_TestCaseInfo).lineInfo;
  SectionInfo::SectionInfo
            ((SectionInfo *)local_e0,_lineInfo,(string *)_name,
             &(_name->super_TestCaseInfo).description);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar2,(SectionInfo *)local_e0);
  sVar3 = (this->m_totals).assertions.passed;
  sVar4 = (this->m_totals).assertions.failed;
  sVar5 = (this->m_totals).assertions.failedButOk;
  std::__cxx11::string::string((string *)local_270,"TEST_CASE",&local_32);
  std::__cxx11::string::string((string *)&testCaseSection.lineInfo.line,"",&local_31);
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)local_510,(string *)local_270,_lineInfo,
             (string *)&testCaseSection.lineInfo.line,Normal);
  AssertionInfo::operator=(&this->m_lastAssertionInfo,(AssertionInfo *)local_510);
  AssertionInfo::~AssertionInfo((AssertionInfo *)local_510);
  std::__cxx11::string::~string((string *)&testCaseSection.lineInfo.line);
  std::__cxx11::string::~string((string *)local_270);
  seedRng((this->m_config).m_p);
  testCaseSection.lineInfo.line = anon_unknown_23::getCurrentTicks();
  uVar6 = (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar6 & 1) == 0) {
    invokeActiveTestCase(this);
  }
  else {
    StreamRedirect::StreamRedirect((StreamRedirect *)local_510,(ostream *)&std::cout,redirectedCout)
    ;
    StreamRedirect::StreamRedirect((StreamRedirect *)local_270,(ostream *)&std::cerr,redirectedCerr)
    ;
    invokeActiveTestCase(this);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_270);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_510);
  }
  _durationInSeconds = Timer::getElapsedSeconds((Timer *)&testCaseSection.lineInfo.line);
  (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
    _vptr_NonCopyable[10])();
  handleUnfinishedSections(this);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  local_270 = (undefined1  [8])((this->m_totals).assertions.passed - sVar3);
  assertions.passed = (this->m_totals).assertions.failed - sVar4;
  assertions.failed = (this->m_totals).assertions.failedButOk - sVar5;
  _missingAssertions = testForMissingAssertions(this,(Counts *)local_270);
  sVar4 = assertions.failed;
  sVar3 = assertions.passed;
  if (((_name->super_TestCaseInfo).properties & (MayFail|ShouldFail)) != None) {
    assertions.failed = assertions.passed;
    assertions.passed = sVar4;
    psVar1 = &(this->m_totals).assertions.failed;
    *psVar1 = *psVar1 - sVar3;
    psVar1 = &(this->m_totals).assertions.failedButOk;
    *psVar1 = *psVar1 + sVar3;
  }
  SectionStats::SectionStats
            ((SectionStats *)local_510,(SectionInfo *)local_e0,(Counts *)local_270,
             _durationInSeconds,_missingAssertions);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,local_510);
  SectionStats::~SectionStats((SectionStats *)local_510);
  SectionInfo::~SectionInfo((SectionInfo *)local_e0);
  return;
}

Assistant:

void runCurrentTest(std::string& redirectedCout, std::string& redirectedCerr) {
			TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
			SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description);
			m_reporter->sectionStarting(testCaseSection);
			Counts prevAssertions = m_totals.assertions;
			double duration = 0;
			try {
				m_lastAssertionInfo = AssertionInfo("TEST_CASE", testCaseInfo.lineInfo, "", ResultDisposition::Normal);

				seedRng(*m_config);

				Timer timer;
				timer.start();
				if (m_reporter->getPreferences().shouldRedirectStdOut) {
					StreamRedirect coutRedir(Catch::cout(), redirectedCout);
					StreamRedirect cerrRedir(Catch::cerr(), redirectedCerr);
					invokeActiveTestCase();
				}
				else {
					invokeActiveTestCase();
				}
				duration = timer.getElapsedSeconds();
			}
			catch (TestFailureException&) {
				// This just means the test was aborted due to failure
			}
			catch (...) {
				makeUnexpectedResultBuilder().useActiveException();
			}
			m_testCaseTracker->close();
			handleUnfinishedSections();
			m_messages.clear();

			Counts assertions = m_totals.assertions - prevAssertions;
			bool missingAssertions = testForMissingAssertions(assertions);

			if (testCaseInfo.okToFail()) {
				std::swap(assertions.failedButOk, assertions.failed);
				m_totals.assertions.failed -= assertions.failedButOk;
				m_totals.assertions.failedButOk += assertions.failedButOk;
			}

			SectionStats testCaseSectionStats(testCaseSection, assertions, duration, missingAssertions);
			m_reporter->sectionEnded(testCaseSectionStats);
		}